

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O0

int Kit_DsdFindLargeBox_rec(Kit_DsdNtk_t *pNtk,int Id,int Size)

{
  int Id_00;
  uint uVar1;
  Kit_DsdObj_t *pKVar2;
  uint local_34;
  uint local_30;
  uint RetValue;
  uint i;
  uint iLit;
  Kit_DsdObj_t *pObj;
  int Size_local;
  int Id_local;
  Kit_DsdNtk_t *pNtk_local;
  
  pKVar2 = Kit_DsdNtkObj(pNtk,Id);
  if (pKVar2 == (Kit_DsdObj_t *)0x0) {
    pNtk_local._4_4_ = 0;
  }
  else if ((((uint)*pKVar2 >> 6 & 7) == 5) && (Size < (int)((uint)*pKVar2 >> 0x1a))) {
    pNtk_local._4_4_ = 1;
  }
  else {
    local_34 = 0;
    for (local_30 = 0; local_30 < (uint)*pKVar2 >> 0x1a; local_30 = local_30 + 1) {
      Id_00 = Abc_Lit2Var((uint)*(ushort *)(&pKVar2[1].field_0x0 + (ulong)local_30 * 2));
      uVar1 = Kit_DsdFindLargeBox_rec(pNtk,Id_00,Size);
      local_34 = uVar1 | local_34;
    }
    pNtk_local._4_4_ = local_34;
  }
  return pNtk_local._4_4_;
}

Assistant:

int Kit_DsdFindLargeBox_rec( Kit_DsdNtk_t * pNtk, int Id, int Size )
{
    Kit_DsdObj_t * pObj;
    unsigned iLit, i, RetValue;
    pObj = Kit_DsdNtkObj( pNtk, Id );
    if ( pObj == NULL )
        return 0;
    if ( pObj->Type == KIT_DSD_PRIME && (int)pObj->nFans > Size )
        return 1;
    RetValue = 0;
    Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
        RetValue |= Kit_DsdFindLargeBox_rec( pNtk, Abc_Lit2Var(iLit), Size );
    return RetValue;
}